

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O1

int checkload(lua_State *L,int stat,char *filename)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (stat != 0) {
    lua_pushstring(L,filename);
    return 2;
  }
  pcVar2 = lua_tolstring(L,1,(size_t *)0x0);
  pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
  iVar1 = luaL_error(L,"error loading module \'%s\' from file \'%s\':\n\t%s",pcVar2,filename,pcVar3)
  ;
  return iVar1;
}

Assistant:

static int checkload (lua_State *L, int stat, const char *filename) {
  if (l_likely(stat)) {  /* module loaded successfully? */
    lua_pushstring(L, filename);  /* will be 2nd argument to module */
    return 2;  /* return open function and file name */
  }
  else
    return luaL_error(L, "error loading module '%s' from file '%s':\n\t%s",
                          lua_tostring(L, 1), filename, lua_tostring(L, -1));
}